

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommenderValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)501>(Result *__return_storage_ptr__,Model *format)

{
  undefined8 interface_00;
  bool bVar1;
  int32 modelVersion;
  exception *error;
  undefined4 local_80;
  Result local_70;
  undefined1 local_48 [8];
  Result result;
  ModelDescription *interface;
  Model *format_local;
  
  result.m_message.field_2._8_8_ = Specification::Model::description(format);
  Result::Result((Result *)local_48);
  interface_00 = result.m_message.field_2._8_8_;
  modelVersion = Specification::Model::specificationversion(format);
  validateModelDescription(&local_70,(ModelDescription *)interface_00,modelVersion);
  Result::operator=((Result *)local_48,&local_70);
  Result::~Result(&local_70);
  bVar1 = Result::good((Result *)local_48);
  if (bVar1) {
    Recommender::constructAndValidateItemSimilarityRecommenderFromSpec((Recommender *)&error,format)
    ;
    std::shared_ptr<CoreML::Recommender::_ItemSimilarityRecommenderData>::~shared_ptr
              ((shared_ptr<CoreML::Recommender::_ItemSimilarityRecommenderData> *)&error);
    Result::Result(__return_storage_ptr__);
  }
  else {
    Result::Result(__return_storage_ptr__,(Result *)local_48);
  }
  local_80 = 1;
  Result::~Result((Result *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_itemSimilarityRecommender>(const Specification::Model& format) {
        const auto& interface = format.description();

        Result result;

            // Validate its a MLModel type.
        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }

        try {
            Recommender::constructAndValidateItemSimilarityRecommenderFromSpec(format);

        } catch (const std::exception& error) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, error.what());
        }

        return Result();
    }